

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mc.cpp
# Opt level: O2

particle * __thiscall
spatial_region::bear_particle
          (spatial_region *this,double cmr,vector3d *position,vector3d *direction,double g,
          double chi,double q)

{
  undefined1 auVar1 [16];
  particle *ppVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  ppVar2 = new_particle(this);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = g;
  ppVar2->cmr = cmr;
  ppVar2->q = q;
  ppVar2->g = g;
  ppVar2->chi = chi;
  dVar3 = position->y;
  ppVar2->x = position->x;
  ppVar2->y = dVar3;
  ppVar2->z = position->z;
  if ((cmr != 0.0) || (NAN(cmr))) {
    auVar5._8_8_ = 0;
    auVar5._0_8_ = direction->x;
    auVar11 = vfmadd213sd_fma(auVar11,auVar11,ZEXT816(0xbff0000000000000));
    auVar10._8_8_ = 0;
    auVar10._0_8_ = direction->y * direction->y;
    auVar5 = vfmadd231sd_fma(auVar10,auVar5,auVar5);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = direction->z;
    auVar5 = vfmadd213sd_fma(auVar6,auVar6,auVar5);
    auVar7._0_8_ = auVar11._0_8_ / auVar5._0_8_;
    auVar7._8_8_ = auVar11._8_8_;
    if (auVar7._0_8_ < 0.0) {
      dVar3 = sqrt(auVar7._0_8_);
    }
    else {
      auVar11 = vsqrtsd_avx(auVar7,auVar7);
      dVar3 = auVar11._0_8_;
    }
    auVar1._0_8_ = direction->x;
    auVar1._8_8_ = direction->y;
    dVar8 = direction->z;
  }
  else {
    auVar1._0_8_ = direction->x;
    auVar1._8_8_ = direction->y;
    dVar8 = direction->z;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = dVar8;
    auVar4._0_8_ = (double)auVar1._0_8_ * (double)auVar1._0_8_;
    auVar4._8_8_ = (double)auVar1._8_8_ * (double)auVar1._8_8_;
    auVar11 = vshufpd_avx(auVar4,auVar4,1);
    auVar11 = vfmadd231sd_fma(auVar11,auVar1,auVar1);
    auVar11 = vfmadd231sd_fma(auVar11,auVar9,auVar9);
    auVar11 = vsqrtsd_avx(auVar11,auVar11);
    dVar3 = g / auVar11._0_8_;
  }
  ppVar2->ux = dVar3 * auVar1._0_8_;
  ppVar2->uy = dVar3 * auVar1._8_8_;
  ppVar2->uz = dVar3 * dVar8;
  ppVar2->trn = 0;
  return ppVar2;
}

Assistant:

particle* spatial_region::bear_particle(double cmr, vector3d& position, vector3d& direction, double g, double chi, double q)
{
    particle* p;
    double a;
    p = new_particle();
    p->cmr = cmr;
    p->q = q;
    p->g = g;
    p->chi = chi;
    p->x = position.x;
    p->y = position.y;
    p->z = position.z;
    if (cmr==0)
        a = g/sqrt(direction.x*direction.x + direction.y*direction.y + direction.z*direction.z);
    else
        a = sqrt((g*g-1)/(direction.x*direction.x + direction.y*direction.y + direction.z*direction.z));
    p->ux = a*direction.x;
    p->uy = a*direction.y;
    p->uz = a*direction.z;
    p->trn = 0;
    return p;
}